

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O0

void logdirs_reopen(void)

{
  bool bVar1;
  uint uVar2;
  uint local_c;
  int ok;
  int l;
  
  bVar1 = false;
  tmaxflag = 0;
  taia_now(&now);
  for (local_c = 0; local_c < dirn; local_c = local_c + 1) {
    logdir_close(dir + (int)local_c);
    uVar2 = logdir_open(dir + (int)local_c,fndir[(int)local_c]);
    if (uVar2 != 0) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    fatalx("no functional log directories.");
  }
  return;
}

Assistant:

void logdirs_reopen(void) {
  int l;
  int ok =0;

  tmaxflag =0;
  taia_now(&now);
  for (l =0; l < dirn; ++l) {
    logdir_close(&dir[l]);
    if (logdir_open(&dir[l], fndir[l])) ok =1;
  }
  if (! ok) fatalx("no functional log directories.");
}